

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_> __thiscall
fmt::v7::detail::
default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::operator()
          (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
           *this,handle handle)

{
  iterator iVar1;
  undefined1 local_78 [8];
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> format_ctx;
  basic_string_view<char> local_50;
  undefined1 local_40 [8];
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> parse_ctx;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *this_local
  ;
  handle handle_local;
  
  handle_local.custom_.value = handle.custom_.format;
  this_local = (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                *)handle.custom_.value;
  parse_ctx._16_8_ = this;
  basic_string_view<char>::basic_string_view(&local_50);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::basic_format_parse_context
            ((basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)local_40,
             local_50.data_,local_50.size_);
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
  basic_format_context
            ((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)local_78,(this->out).container,this->args,(locale_ref)(this->loc).locale_);
  basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::handle::format((handle *)&this_local,(parse_context_type *)local_40,
                   (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                    *)local_78);
  iVar1 = basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::out
                    ((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                      *)local_78);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)iVar1.container;
}

Assistant:

OutputIt operator()(typename basic_format_arg<context>::handle handle) {
    basic_format_parse_context<Char> parse_ctx({});
    basic_format_context<OutputIt, Char> format_ctx(out, args, loc);
    handle.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }